

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O2

void Ivy_CutComputeAll(Ivy_Man_t *p,int nInputs)

{
  abctime aVar1;
  Ivy_Obj_t *pObj;
  abctime aVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  
  aVar1 = Abc_Clock();
  if (6 < nInputs) {
    printf("Cannot compute cuts for more than %d inputs.\n",6);
    return;
  }
  uVar4 = -(p->nObjs[5] + p->nObjs[6]);
  uVar5 = 0;
  uVar6 = 0;
  uVar3 = uVar4;
  for (iVar7 = 0; iVar7 < p->vObjs->nSize; iVar7 = iVar7 + 1) {
    pObj = (Ivy_Obj_t *)Vec_PtrEntry(p->vObjs,iVar7);
    if ((pObj != (Ivy_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x8 & 0xf) - 7)) {
      Ivy_CutComputeForNode(p,pObj,nInputs);
      uVar4 = uVar4 + Ivy_CutComputeForNode::CutStore.nCuts;
      uVar3 = uVar3 + Ivy_CutComputeForNode::CutStore.nCutsM;
      uVar6 = uVar6 + Ivy_CutComputeForNode::CutStore.fSatur;
      uVar5 = uVar5 + 1;
    }
  }
  iVar7 = 0x7ca922;
  printf("All = %6d. Minus = %6d. Triv = %6d.   Node = %6d. Satur = %6d.  ",(ulong)uVar4,
         (ulong)uVar3,(ulong)(uint)(p->nObjs[5] + p->nObjs[1] + p->nObjs[6]),(ulong)uVar5,
         (ulong)uVar6);
  Abc_Print(iVar7,"%s =","Time");
  aVar2 = Abc_Clock();
  Abc_Print(iVar7,"%9.2f sec\n",(double)(aVar2 - aVar1) / 1000000.0);
  return;
}

Assistant:

void Ivy_CutComputeAll( Ivy_Man_t * p, int nInputs )
{
    Ivy_Store_t * pStore;
    Ivy_Obj_t * pObj;
    int i, nCutsTotal, nCutsTotalM, nNodeTotal, nNodeOver;
    abctime clk = Abc_Clock();
    if ( nInputs > IVY_CUT_INPUT )
    {
        printf( "Cannot compute cuts for more than %d inputs.\n", IVY_CUT_INPUT );
        return;
    }
    nNodeTotal = nNodeOver = 0;
    nCutsTotal = nCutsTotalM = -Ivy_ManNodeNum(p);
    Ivy_ManForEachObj( p, pObj, i )
    {
        if ( !Ivy_ObjIsNode(pObj) )
            continue;
        pStore = Ivy_CutComputeForNode( p, pObj, nInputs );
        nCutsTotal  += pStore->nCuts;
        nCutsTotalM += pStore->nCutsM;
        nNodeOver   += pStore->fSatur;
        nNodeTotal++;
    }
    printf( "All = %6d. Minus = %6d. Triv = %6d.   Node = %6d. Satur = %6d.  ", 
        nCutsTotal, nCutsTotalM, Ivy_ManPiNum(p) + Ivy_ManNodeNum(p), nNodeTotal, nNodeOver );
    ABC_PRT( "Time", Abc_Clock() - clk );
}